

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

int uv_os_tmpdir(char *buffer,size_t *size)

{
  ulong uVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  char *pcVar4;
  
  iVar2 = -0x16;
  if ((size != (size_t *)0x0 && buffer != (char *)0x0) && (uVar1 = *size, iVar2 = -0x16, uVar1 != 0)
     ) {
    __s = getenv("TMPDIR");
    if ((__s == (char *)0x0) &&
       ((__s = getenv("TMP"), __s == (char *)0x0 && (__s = getenv("TEMP"), __s == (char *)0x0)))) {
      pcVar4 = getenv("TEMPDIR");
      __s = "/tmp";
      if (pcVar4 != (char *)0x0) {
        __s = pcVar4;
      }
    }
    sVar3 = strlen(__s);
    if (sVar3 < uVar1) {
      if ((1 < sVar3) && (__s[sVar3 - 1] == '/')) {
        sVar3 = sVar3 - 1;
      }
      memcpy(buffer,__s,sVar3 + 1);
      buffer[sVar3] = '\0';
      iVar2 = 0;
    }
    else {
      sVar3 = sVar3 + 1;
      iVar2 = -0x69;
    }
    *size = sVar3;
  }
  return iVar2;
}

Assistant:

int uv_os_tmpdir(char* buffer, size_t* size) {
  const char* buf;
  size_t len;

  if (buffer == NULL || size == NULL || *size == 0)
    return UV_EINVAL;

#define CHECK_ENV_VAR(name)                                                   \
  do {                                                                        \
    buf = getenv(name);                                                       \
    if (buf != NULL)                                                          \
      goto return_buffer;                                                     \
  }                                                                           \
  while (0)

  /* Check the TMPDIR, TMP, TEMP, and TEMPDIR environment variables in order */
  CHECK_ENV_VAR("TMPDIR");
  CHECK_ENV_VAR("TMP");
  CHECK_ENV_VAR("TEMP");
  CHECK_ENV_VAR("TEMPDIR");

#undef CHECK_ENV_VAR

  /* No temp environment variables defined */
  #if defined(__ANDROID__)
    buf = "/data/local/tmp";
  #else
    buf = "/tmp";
  #endif

return_buffer:
  len = strlen(buf);

  if (len >= *size) {
    *size = len + 1;
    return UV_ENOBUFS;
  }

  /* The returned directory should not have a trailing slash. */
  if (len > 1 && buf[len - 1] == '/') {
    len--;
  }

  memcpy(buffer, buf, len + 1);
  buffer[len] = '\0';
  *size = len;

  return 0;
}